

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_ENCHANT(effect_handler_context_t_conflict *context)

{
  uint uVar1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t num_ac;
  command *cmd;
  wchar_t wVar4;
  wchar_t wVar5;
  
  num_ac = randcalc((random_value)context->value,(int)player->depth,RANDOMISE);
  context->ident = true;
  uVar1 = context->subtype;
  wVar5 = num_ac;
  wVar4 = num_ac;
  if ((~uVar1 & 3) == 0) {
    cmd = context->cmd;
  }
  else if ((uVar1 & 1) == 0) {
    if ((uVar1 & 2) == 0) {
      _Var2 = false;
      goto LAB_0013d135;
    }
    cmd = context->cmd;
    wVar5 = L'\0';
  }
  else {
    cmd = context->cmd;
    wVar4 = L'\0';
  }
  _Var2 = enchant_spell(wVar5,wVar4,L'\0',cmd);
LAB_0013d135:
  if ((context->subtype & 4) != 0) {
    _Var3 = enchant_spell(L'\0',L'\0',num_ac,context->cmd);
    _Var2 = (_Bool)(_Var2 | _Var3);
  }
  return _Var2;
}

Assistant:

bool effect_handler_ENCHANT(effect_handler_context_t *context)
{
	int value = randcalc(context->value, player->depth, RANDOMISE);
	bool used = false;
	context->ident = true;

	if ((context->subtype & ENCH_TOBOTH) == ENCH_TOBOTH) {
		if (enchant_spell(value, value, 0, context->cmd))
			used = true;
	}
	else if (context->subtype & ENCH_TOHIT) {
		if (enchant_spell(value, 0, 0, context->cmd))
			used = true;
	}
	else if (context->subtype & ENCH_TODAM) {
		if (enchant_spell(0, value, 0, context->cmd))
			used = true;
	}
	if (context->subtype & ENCH_TOAC) {
		if (enchant_spell(0, 0, value, context->cmd))
			used = true;
	}

	return used;
}